

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlAttrPtr xmlNewDocProp(xmlDocPtr doc,xmlChar *name,xmlChar *value)

{
  int iVar1;
  xmlNodePtr parent;
  xmlChar *pxVar2;
  xmlRegisterNodeFunc *pp_Var3;
  
  if ((name != (xmlChar *)0x0) &&
     (parent = (xmlNodePtr)(*xmlMalloc)(0x68), parent != (xmlNodePtr)0x0)) {
    parent->_private = (void *)0x0;
    *(undefined8 *)&parent->type = 0;
    parent->content = (xmlChar *)0x0;
    parent->properties = (_xmlAttr *)0x0;
    parent->doc = (_xmlDoc *)0x0;
    parent->ns = (xmlNs *)0x0;
    parent->next = (_xmlNode *)0x0;
    parent->prev = (_xmlNode *)0x0;
    parent->last = (_xmlNode *)0x0;
    parent->parent = (_xmlNode *)0x0;
    parent->name = (xmlChar *)0x0;
    parent->children = (_xmlNode *)0x0;
    parent->nsDef = (xmlNs *)0x0;
    parent->type = XML_ATTRIBUTE_NODE;
    if ((doc == (xmlDocPtr)0x0) || (doc->dict == (xmlDictPtr)0x0)) {
      pxVar2 = xmlStrdup(name);
    }
    else {
      pxVar2 = xmlDictLookup(doc->dict,name,-1);
    }
    parent->name = pxVar2;
    if ((pxVar2 != (xmlChar *)0x0) &&
       ((parent->doc = doc, value == (xmlChar *)0x0 ||
        (iVar1 = xmlNodeParseContentInternal(doc,parent,value,-1,(xmlNodePtr *)0x0), -1 < iVar1))))
    {
      if (xmlRegisterCallbacks == 0) {
        return (xmlAttrPtr)parent;
      }
      pp_Var3 = __xmlRegisterNodeDefaultValue();
      if (*pp_Var3 == (xmlRegisterNodeFunc)0x0) {
        return (xmlAttrPtr)parent;
      }
      pp_Var3 = __xmlRegisterNodeDefaultValue();
      (**pp_Var3)(parent);
      return (xmlAttrPtr)parent;
    }
    xmlFreeProp((xmlAttrPtr)parent);
  }
  return (xmlAttrPtr)0x0;
}

Assistant:

xmlAttrPtr
xmlNewDocProp(xmlDocPtr doc, const xmlChar *name, const xmlChar *value) {
    xmlAttrPtr cur;

    if (name == NULL) {
	return(NULL);
    }

    /*
     * Allocate a new property and fill the fields.
     */
    cur = (xmlAttrPtr) xmlMalloc(sizeof(xmlAttr));
    if (cur == NULL)
	return(NULL);
    memset(cur, 0, sizeof(xmlAttr));
    cur->type = XML_ATTRIBUTE_NODE;

    if ((doc != NULL) && (doc->dict != NULL))
	cur->name = xmlDictLookup(doc->dict, name, -1);
    else
	cur->name = xmlStrdup(name);
    if (cur->name == NULL)
        goto error;
    cur->doc = doc;
    if (value != NULL) {
	if (xmlNodeParseContent((xmlNodePtr) cur, value, -1) < 0)
            goto error;
    }

    if ((xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	xmlRegisterNodeDefaultValue((xmlNodePtr)cur);
    return(cur);

error:
    xmlFreeProp(cur);
    return(NULL);
}